

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::Render(void)

{
  int *piVar1;
  ImVec2 IVar2;
  ImGuiViewportP *pIVar3;
  ImGuiWindow *pIVar4;
  ImGuiWindow *window;
  ImGuiContext *ctx;
  ImGuiContext *pIVar5;
  ImU32 IVar6;
  ImDrawList *pIVar7;
  ImGuiWindow *pIVar8;
  char cVar9;
  int iVar10;
  ImDrawList **ppIVar11;
  int iVar12;
  int n;
  ulong uVar13;
  int n_4;
  long lVar14;
  int n_2;
  long lVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  ImRect IVar22;
  ImGuiWindow *windows_to_render_top_most [2];
  ImVec2 local_38;
  
  ctx = GImGui;
  iVar12 = GImGui->FrameCountEnded;
  if (iVar12 != GImGui->FrameCount) {
    EndFrame();
    iVar12 = ctx->FrameCount;
  }
  iVar10 = ctx->FrameCountRendered;
  ctx->FrameCountRendered = iVar12;
  (ctx->IO).MetricsRenderWindows = 0;
  CallContextHooks(ctx,ImGuiContextHookType_RenderPre);
  for (uVar13 = 0; pIVar5 = GImGui, uVar13 != (uint)(ctx->Viewports).Size; uVar13 = uVar13 + 1) {
    pIVar3 = (ctx->Viewports).Data[uVar13];
    ImDrawDataBuilder::Clear(&pIVar3->DrawDataBuilder);
    if (pIVar3->DrawLists[0] != (ImDrawList *)0x0) {
      pIVar7 = GetBackgroundDrawList(&pIVar3->super_ImGuiViewport);
      AddDrawListToDrawData((pIVar3->DrawDataBuilder).Layers,pIVar7);
    }
  }
  if (iVar10 != iVar12) {
    pIVar8 = GetTopMostAndVisiblePopupModal();
    if ((0.0 < pIVar5->DimBgRatio) || (0.0 < pIVar5->NavWindowingHighlightAlpha)) {
      pIVar4 = pIVar5->NavWindowingTargetAnim;
      if (pIVar4 == (ImGuiWindow *)0x0) {
        cVar9 = '\0';
      }
      else {
        cVar9 = pIVar4->Active;
      }
      if ((pIVar8 != (ImGuiWindow *)0x0) || (cVar9 != '\0')) {
        if (pIVar8 == (ImGuiWindow *)0x0) {
          if (cVar9 != '\0') {
            IVar6 = GetColorU32(0x33,pIVar5->DimBgRatio);
            RenderDimmedBackgroundBehindWindow(pIVar4,IVar6);
            pIVar8 = pIVar5->NavWindowingTargetAnim;
            pIVar3 = *(GImGui->Viewports).Data;
            fVar17 = pIVar5->FontSize;
            IVar22 = ImGuiWindow::Rect(pIVar8);
            fVar20 = IVar22.Min.x - fVar17;
            fVar21 = IVar22.Min.y - fVar17;
            fVar18 = fVar17 + IVar22.Max.x;
            fVar19 = fVar17 + IVar22.Max.y;
            windows_to_render_top_most[0] = (ImGuiWindow *)CONCAT44(fVar21,fVar20);
            windows_to_render_top_most[1] = (ImGuiWindow *)CONCAT44(fVar19,fVar18);
            fVar16 = (pIVar3->super_ImGuiViewport).Size.x;
            if ((fVar16 <= fVar18 - fVar20) &&
               ((pIVar3->super_ImGuiViewport).Size.y <= fVar19 - fVar21)) {
              fVar17 = -1.0 - fVar17;
              windows_to_render_top_most[0] =
                   (ImGuiWindow *)CONCAT44(fVar21 - fVar17,fVar20 - fVar17);
              windows_to_render_top_most[1] =
                   (ImGuiWindow *)CONCAT44(fVar17 + fVar19,fVar17 + fVar18);
            }
            pIVar7 = pIVar8->DrawList;
            if ((pIVar7->CmdBuffer).Size == 0) {
              ImDrawList::AddDrawCmd(pIVar7);
              pIVar7 = pIVar8->DrawList;
              fVar16 = (pIVar3->super_ImGuiViewport).Size.x;
            }
            IVar2 = (pIVar3->super_ImGuiViewport).Pos;
            local_38.y = (pIVar3->super_ImGuiViewport).Size.y + IVar2.y;
            local_38.x = fVar16 + IVar2.x;
            ImDrawList::PushClipRect(pIVar7,&(pIVar3->super_ImGuiViewport).Pos,&local_38,false);
            pIVar7 = pIVar8->DrawList;
            IVar6 = GetColorU32(0x32,pIVar5->NavWindowingHighlightAlpha);
            ImDrawList::AddRect(pIVar7,(ImVec2 *)windows_to_render_top_most,
                                (ImVec2 *)(windows_to_render_top_most + 1),IVar6,
                                pIVar8->WindowRounding,0,3.0);
            ImDrawList::PopClipRect(pIVar8->DrawList);
          }
        }
        else {
          pIVar8 = FindBottomMostVisibleWindowWithinBeginStack(pIVar8);
          IVar6 = GetColorU32(0x34,pIVar5->DimBgRatio);
          RenderDimmedBackgroundBehindWindow(pIVar8,IVar6);
        }
      }
    }
  }
  pIVar8 = ctx->NavWindowingTarget;
  if (pIVar8 == (ImGuiWindow *)0x0) {
    windows_to_render_top_most[0] = (ImGuiWindow *)0x0;
    pIVar8 = (ImGuiWindow *)0x0;
  }
  else {
    if ((pIVar8->Flags & 0x2000) == 0) {
      windows_to_render_top_most[0] = pIVar8->RootWindow;
    }
    else {
      windows_to_render_top_most[0] = (ImGuiWindow *)0x0;
    }
    pIVar8 = ctx->NavWindowingListWindow;
  }
  pIVar4 = windows_to_render_top_most[0];
  windows_to_render_top_most[1] = pIVar8;
  for (uVar13 = 0; uVar13 != (uint)(ctx->Windows).Size; uVar13 = uVar13 + 1) {
    window = (ctx->Windows).Data[uVar13];
    if (((window->Active == true) && (window->Hidden == false)) &&
       ((window != pIVar8 && window != pIVar4) && (window->Flags & 0x1000000) == 0)) {
      AddRootWindowToDrawData(window);
    }
  }
  for (lVar15 = 0; lVar15 != 2; lVar15 = lVar15 + 1) {
    pIVar8 = windows_to_render_top_most[lVar15];
    if (((pIVar8 != (ImGuiWindow *)0x0) && (pIVar8->Active == true)) && (pIVar8->Hidden == false)) {
      AddRootWindowToDrawData(pIVar8);
    }
  }
  if (((iVar10 != iVar12) && ((ctx->IO).MouseDrawCursor != false)) && (ctx->MouseCursor != -1)) {
    RenderMouseCursor((ctx->IO).MousePos,(ctx->Style).MouseCursorScale,ctx->MouseCursor,0xffffffff,
                      0xff000000,0x30000000);
  }
  (ctx->IO).MetricsRenderVertices = 0;
  (ctx->IO).MetricsRenderIndices = 0;
  for (lVar15 = 0; lVar15 < (ctx->Viewports).Size; lVar15 = lVar15 + 1) {
    pIVar3 = (ctx->Viewports).Data[lVar15];
    ImDrawDataBuilder::FlattenIntoSingleLayer(&pIVar3->DrawDataBuilder);
    if (pIVar3->DrawLists[1] != (ImDrawList *)0x0) {
      pIVar7 = GetForegroundDrawList(&pIVar3->super_ImGuiViewport);
      AddDrawListToDrawData((pIVar3->DrawDataBuilder).Layers,pIVar7);
    }
    pIVar5 = GImGui;
    (pIVar3->DrawDataP).Valid = true;
    iVar12 = (pIVar3->DrawDataBuilder).Layers[0].Size;
    if (iVar12 < 1) {
      ppIVar11 = (ImDrawList **)0x0;
    }
    else {
      ppIVar11 = (pIVar3->DrawDataBuilder).Layers[0].Data;
    }
    (pIVar3->DrawDataP).CmdLists = ppIVar11;
    (pIVar3->DrawDataP).CmdListsCount = iVar12;
    (pIVar3->DrawDataP).TotalIdxCount = 0;
    (pIVar3->DrawDataP).TotalVtxCount = 0;
    IVar2 = (pIVar3->super_ImGuiViewport).Size;
    (pIVar3->DrawDataP).DisplayPos = (pIVar3->super_ImGuiViewport).Pos;
    (pIVar3->DrawDataP).DisplaySize = IVar2;
    (pIVar3->DrawDataP).FramebufferScale = (pIVar5->IO).DisplayFramebufferScale;
    iVar10 = 0;
    for (lVar14 = 0; lVar14 < iVar12; lVar14 = lVar14 + 1) {
      pIVar7 = (pIVar3->DrawDataBuilder).Layers[0].Data[lVar14];
      ImDrawList::_PopUnusedDrawCmd(pIVar7);
      iVar12 = (pIVar3->DrawDataBuilder).Layers[0].Size;
      iVar10 = (pIVar3->DrawDataP).TotalVtxCount + (pIVar7->VtxBuffer).Size;
      (pIVar3->DrawDataP).TotalVtxCount = iVar10;
      piVar1 = &(pIVar3->DrawDataP).TotalIdxCount;
      *piVar1 = *piVar1 + (pIVar7->IdxBuffer).Size;
    }
    piVar1 = &(ctx->IO).MetricsRenderVertices;
    *piVar1 = *piVar1 + iVar10;
    piVar1 = &(ctx->IO).MetricsRenderIndices;
    *piVar1 = *piVar1 + (pIVar3->DrawDataP).TotalIdxCount;
  }
  CallContextHooks(ctx,ImGuiContextHookType_RenderPost);
  return;
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    if (g.FrameCountEnded != g.FrameCount)
        EndFrame();
    const bool first_render_of_frame = (g.FrameCountRendered != g.FrameCount);
    g.FrameCountRendered = g.FrameCount;
    g.IO.MetricsRenderWindows = 0;

    CallContextHooks(&g, ImGuiContextHookType_RenderPre);

    // Add background ImDrawList (for each active viewport)
    for (int n = 0; n != g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.Clear();
        if (viewport->DrawLists[0] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetBackgroundDrawList(viewport));
    }

    // Draw modal/window whitening backgrounds
    if (first_render_of_frame)
        RenderDimmedBackgrounds();

    // Add ImDrawList to render
    ImGuiWindow* windows_to_render_top_most[2];
    windows_to_render_top_most[0] = (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) ? g.NavWindowingTarget->RootWindow : NULL;
    windows_to_render_top_most[1] = (g.NavWindowingTarget ? g.NavWindowingListWindow : NULL);
    for (int n = 0; n != g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        IM_MSVC_WARNING_SUPPRESS(6011); // Static Analysis false positive "warning C6011: Dereferencing NULL pointer 'window'"
        if (IsWindowActiveAndVisible(window) && (window->Flags & ImGuiWindowFlags_ChildWindow) == 0 && window != windows_to_render_top_most[0] && window != windows_to_render_top_most[1])
            AddRootWindowToDrawData(window);
    }
    for (int n = 0; n < IM_ARRAYSIZE(windows_to_render_top_most); n++)
        if (windows_to_render_top_most[n] && IsWindowActiveAndVisible(windows_to_render_top_most[n])) // NavWindowingTarget is always temporarily displayed as the top-most window
            AddRootWindowToDrawData(windows_to_render_top_most[n]);

    // Draw software mouse cursor if requested by io.MouseDrawCursor flag
    if (g.IO.MouseDrawCursor && first_render_of_frame && g.MouseCursor != ImGuiMouseCursor_None)
        RenderMouseCursor(g.IO.MousePos, g.Style.MouseCursorScale, g.MouseCursor, IM_COL32_WHITE, IM_COL32_BLACK, IM_COL32(0, 0, 0, 48));

    // Setup ImDrawData structures for end-user
    g.IO.MetricsRenderVertices = g.IO.MetricsRenderIndices = 0;
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.FlattenIntoSingleLayer();

        // Add foreground ImDrawList (for each active viewport)
        if (viewport->DrawLists[1] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetForegroundDrawList(viewport));

        SetupViewportDrawData(viewport, &viewport->DrawDataBuilder.Layers[0]);
        ImDrawData* draw_data = &viewport->DrawDataP;
        g.IO.MetricsRenderVertices += draw_data->TotalVtxCount;
        g.IO.MetricsRenderIndices += draw_data->TotalIdxCount;
    }

    CallContextHooks(&g, ImGuiContextHookType_RenderPost);
}